

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

double * __thiscall
google::protobuf::RepeatedField<double>::at(RepeatedField<double> *this,int index)

{
  LogMessage *this_00;
  double *pdVar1;
  int in_ESI;
  int *in_RDI;
  LogMessage *in_stack_ffffffffffffff38;
  LogMessage *other;
  LogMessage *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  LogLevel level;
  LogMessage *in_stack_ffffffffffffff50;
  LogMessage local_98;
  RepeatedField<double> *in_stack_ffffffffffffffa0;
  undefined1 local_48 [60];
  int local_c;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_c = in_ESI;
  if (in_ESI < 0) {
    level = (LogLevel)((ulong)local_48 >> 0x20);
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff50,level,(char *)in_stack_ffffffffffffff40,
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    in_stack_ffffffffffffff50 =
         internal::LogMessage::operator<<
                   (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    internal::LogMessage::~LogMessage((LogMessage *)0x43456f);
  }
  if (*in_RDI <= local_c) {
    other = &local_98;
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff50,level,(char *)in_stack_ffffffffffffff40,
               (int)((ulong)other >> 0x20));
    this_00 = internal::LogMessage::operator<<(in_stack_ffffffffffffff40,(char *)other);
    internal::LogFinisher::operator=((LogFinisher *)this_00,other);
    internal::LogMessage::~LogMessage((LogMessage *)0x4345e9);
  }
  pdVar1 = elements(in_stack_ffffffffffffffa0);
  return pdVar1 + local_c;
}

Assistant:

inline Element& RepeatedField<Element>::at(int index) {
  GOOGLE_CHECK_GE(index, 0);
  GOOGLE_CHECK_LT(index, current_size_);
  return elements()[index];
}